

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O0

float Amap_CutAreaDeref(Amap_Man_t *p,Amap_Mat_t *pM)

{
  Amap_Cut_t *pAVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Amap_Gat_t *pAVar5;
  Amap_Obj_t *pObj;
  float fVar6;
  float local_2c;
  float Area;
  int fCompl;
  int i;
  Amap_Obj_t *pFanin;
  Amap_Mat_t *pM_local;
  Amap_Man_t *p_local;
  
  pAVar5 = Amap_LibGate(p->pLib,*(uint *)&pM->pSet->field_0x8 & 0xffff);
  local_2c = (float)pAVar5->dArea;
  Area = 0.0;
  while( true ) {
    if ((int)((uint)*pM->pCut >> 0x11) <= (int)Area) {
      return local_2c;
    }
    pAVar1 = pM->pCut;
    iVar2 = Abc_Lit2Var((int)pM->pSet->Ins[(int)Area]);
    iVar2 = Abc_Lit2Var((int)pAVar1[(long)iVar2 + 1]);
    pObj = Amap_ManObj(p,iVar2);
    uVar3 = Abc_LitIsCompl((int)pM->pSet->Ins[(int)Area]);
    pAVar1 = pM->pCut;
    iVar2 = Abc_Lit2Var((int)pM->pSet->Ins[(int)Area]);
    uVar4 = Abc_LitIsCompl((int)pAVar1[(long)iVar2 + 1]);
    uVar3 = uVar3 ^ uVar4;
    iVar2 = Amap_ObjRefsTotal(pObj);
    if (iVar2 < 1) break;
    if (((uint)((ulong)*(undefined8 *)pObj >> 0x3f) != uVar3) && (pObj->nFouts[(int)uVar3] == 1)) {
      local_2c = p->fAreaInv + local_2c;
    }
    iVar2 = pObj->nFouts[(int)uVar3] + -1;
    pObj->nFouts[(int)uVar3] = iVar2;
    if ((iVar2 + pObj->nFouts[(int)(uint)((uVar3 != 0 ^ 0xffU) & 1)] == 0) &&
       (iVar2 = Amap_ObjIsNode(pObj), iVar2 != 0)) {
      fVar6 = Amap_CutAreaDeref(p,&pObj->Best);
      local_2c = fVar6 + local_2c;
    }
    Area = (float)((int)Area + 1);
  }
  __assert_fail("Amap_ObjRefsTotal(pFanin) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapMatch.c"
                ,0x11a,"float Amap_CutAreaDeref(Amap_Man_t *, Amap_Mat_t *)");
}

Assistant:

static inline float Amap_CutAreaDeref( Amap_Man_t * p, Amap_Mat_t * pM )
{
    Amap_Obj_t * pFanin;
    int i, fCompl;
    float Area = Amap_LibGate( p->pLib, pM->pSet->iGate )->dArea;
    Amap_MatchForEachFaninCompl( p, pM, pFanin, fCompl, i )
    {
        assert( Amap_ObjRefsTotal(pFanin) > 0 );
        if ( (int)pFanin->fPolar != fCompl && pFanin->nFouts[fCompl] == 1 )
            Area += p->fAreaInv;
        if ( --pFanin->nFouts[fCompl] + pFanin->nFouts[!fCompl] == 0 && Amap_ObjIsNode(pFanin) )
            Area += Amap_CutAreaDeref( p, &pFanin->Best );
    }
    return Area;
}